

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.hpp
# Opt level: O0

unique_ptr<so_5::user_type_message_t<so_5::coop_t_*>,_std::default_delete<so_5::user_type_message_t<so_5::coop_t_*>_>_>
 __thiscall
so_5::details::make_message_instance_impl<false,so_5::coop_t*>::make<so_5::coop_t*&>
          (make_message_instance_impl<false,so_5::coop_t*> *this,coop_t **args)

{
  user_type_message_t<so_5::coop_t_*> *this_00;
  coop_t **args_local;
  
  ensure_not_signal<so_5::coop_t*>();
  this_00 = (user_type_message_t<so_5::coop_t_*> *)operator_new(0x20);
  user_type_message_t<so_5::coop_t_*>::user_type_message_t(this_00,args);
  std::
  unique_ptr<so_5::user_type_message_t<so_5::coop_t*>,std::default_delete<so_5::user_type_message_t<so_5::coop_t*>>>
  ::unique_ptr<std::default_delete<so_5::user_type_message_t<so_5::coop_t*>>,void>
            ((unique_ptr<so_5::user_type_message_t<so_5::coop_t*>,std::default_delete<so_5::user_type_message_t<so_5::coop_t*>>>
              *)this,this_00);
  return (__uniq_ptr_data<so_5::user_type_message_t<so_5::coop_t_*>,_std::default_delete<so_5::user_type_message_t<so_5::coop_t_*>_>,_true,_true>
          )(__uniq_ptr_data<so_5::user_type_message_t<so_5::coop_t_*>,_std::default_delete<so_5::user_type_message_t<so_5::coop_t_*>_>,_true,_true>
            )this;
}

Assistant:

static std::unique_ptr< E >
		make( ARGS &&... args )
			{
				ensure_not_signal< MSG >();

				return std::unique_ptr< E >( new E( std::forward< ARGS >(args)... ) );
			}